

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O0

void __thiscall
NavierStokesBase::restart(NavierStokesBase *this,Amr *papa,istream *is,bool bReadSpecial)

{
  bool bVar1;
  int iVar2;
  NavierStokesBase *pNVar3;
  Projection *pPVar4;
  MacProj *pMVar5;
  StateData *this_00;
  DistributionMapping *dmap;
  void *pvVar6;
  long lVar7;
  FabFactory<amrex::FArrayBox> *pFVar8;
  BoxArray *pBVar9;
  byte in_CL;
  IntVect *ref_ratio;
  long in_RDI;
  Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *v;
  Real in_stack_00000078;
  NavierStokesBase *in_stack_00000080;
  int ng_sync;
  BoxArray *P_grids;
  Real time;
  Real dt;
  Real prev_time;
  Real cur_time;
  DistributionMapping *in_stack_fffffffffffff718;
  NavierStokesBase *in_stack_fffffffffffff720;
  Geometry *in_stack_fffffffffffff728;
  undefined1 *a_new_size;
  NavierStokesBase *in_stack_fffffffffffff730;
  PODVector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *this_01;
  Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *in_stack_fffffffffffff738;
  StateData *in_stack_fffffffffffff740;
  BoxArray *in_stack_fffffffffffff748;
  FluxRegister *in_stack_fffffffffffff750;
  BoxArray *in_stack_fffffffffffff758;
  MultiFab *in_stack_fffffffffffff760;
  BoxArray *in_stack_fffffffffffff768;
  MultiFab *in_stack_fffffffffffff770;
  FabFactory<amrex::FArrayBox> *factory;
  FabFactory<amrex::FArrayBox> *in_stack_fffffffffffff780;
  Print *in_stack_fffffffffffff790;
  StateData *in_stack_fffffffffffff7a0;
  FabFactory<amrex::FArrayBox> *in_stack_fffffffffffff7c8;
  Real in_stack_fffffffffffff7d0;
  undefined4 in_stack_fffffffffffff7d8;
  undefined4 in_stack_fffffffffffff7dc;
  StateDescriptor *in_stack_fffffffffffff7e0;
  DistributionMapping *in_stack_fffffffffffff7e8;
  BoxArray *in_stack_fffffffffffff7f0;
  Box *in_stack_fffffffffffff7f8;
  StateData *in_stack_fffffffffffff800;
  FluxRegister *in_stack_fffffffffffff860;
  undefined8 in_stack_fffffffffffff868;
  int iVar10;
  Diffusion *in_stack_fffffffffffff870;
  undefined4 in_stack_fffffffffffff878;
  int in_stack_fffffffffffff87c;
  Amr *in_stack_fffffffffffff880;
  int in_stack_fffffffffffff888;
  int iVar11;
  Vector<int,_std::allocator<int>_> *in_stack_fffffffffffff8a0;
  undefined8 in_stack_fffffffffffff8b0;
  undefined1 bReadSpecial_00;
  istream *in_stack_fffffffffffff8b8;
  Amr *in_stack_fffffffffffff8c0;
  AmrLevel *in_stack_fffffffffffff8c8;
  undefined8 in_stack_fffffffffffff8f0;
  undefined8 in_stack_fffffffffffff8f8;
  BCRec *in_stack_fffffffffffff900;
  SyncRegister *in_stack_fffffffffffff908;
  AmrLevel *in_stack_fffffffffffff910;
  int _finest_level;
  Amr *in_stack_fffffffffffff918;
  AmrLevel *in_stack_fffffffffffff920;
  undefined8 in_stack_fffffffffffff928;
  MacProj *in_stack_fffffffffffff930;
  PODVector<amrex::BCRec,_std::allocator<amrex::BCRec>_> local_5e0 [2];
  undefined1 local_5b0 [55];
  undefined1 local_579;
  undefined8 local_578;
  undefined8 uStack_570;
  undefined8 local_568;
  undefined8 uStack_560;
  undefined8 local_558;
  undefined1 local_549;
  undefined1 local_548 [192];
  undefined1 local_488 [128];
  element_type *local_408;
  Amr *local_3f8 [13];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  aStack_390;
  undefined8 uStack_380;
  element_type *local_378;
  undefined8 local_368;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_360;
  pointer local_358;
  pointer local_350;
  Real local_348;
  byte local_19;
  
  iVar10 = (int)((ulong)in_stack_fffffffffffff868 >> 0x20);
  iVar2 = (int)((ulong)in_stack_fffffffffffff928 >> 0x20);
  iVar11 = (int)((ulong)in_stack_fffffffffffff8f0 >> 0x20);
  bReadSpecial_00 = (undefined1)((ulong)in_stack_fffffffffffff8b0 >> 0x38);
  local_19 = in_CL & 1;
  amrex::OutStream();
  amrex::Print::Print((Print *)in_stack_fffffffffffff750,(ostream *)in_stack_fffffffffffff748);
  pNVar3 = (NavierStokesBase *)
           amrex::Print::operator<<
                     ((Print *)in_stack_fffffffffffff720,(char (*) [67])in_stack_fffffffffffff718);
  amrex::Print::operator<<
            ((Print *)in_stack_fffffffffffff720,(char (*) [66])in_stack_fffffffffffff718);
  amrex::Print::operator<<
            ((Print *)in_stack_fffffffffffff720,(char (*) [39])in_stack_fffffffffffff718);
  amrex::Print::operator<<
            ((Print *)in_stack_fffffffffffff720,
             (_func_basic_ostream<char,_std::char_traits<char>_>_ptr_basic_ostream<char,_std::char_traits<char>_>_ptr
              *)in_stack_fffffffffffff718);
  amrex::Print::~Print(in_stack_fffffffffffff790);
  amrex::AmrLevel::restart
            (in_stack_fffffffffffff8c8,in_stack_fffffffffffff8c0,in_stack_fffffffffffff8b8,
             (bool)bReadSpecial_00);
  if (gradp_in_checkpoint == 0) {
    amrex::OutStream();
    amrex::Print::Print((Print *)in_stack_fffffffffffff750,(ostream *)in_stack_fffffffffffff748);
    amrex::Print::operator<<
              ((Print *)in_stack_fffffffffffff720,(char (*) [72])in_stack_fffffffffffff718);
    amrex::Print::operator<<
              ((Print *)in_stack_fffffffffffff720,
               (_func_basic_ostream<char,_std::char_traits<char>_>_ptr_basic_ostream<char,_std::char_traits<char>_>_ptr
                *)in_stack_fffffffffffff718);
    amrex::Print::~Print(in_stack_fffffffffffff790);
    amrex::Vector<amrex::StateData,_std::allocator<amrex::StateData>_>::operator[]
              ((Vector<amrex::StateData,_std::allocator<amrex::StateData>_> *)
               in_stack_fffffffffffff720,(size_type)in_stack_fffffffffffff718);
    local_348 = amrex::StateData::curTime(in_stack_fffffffffffff740);
    amrex::Vector<amrex::StateData,_std::allocator<amrex::StateData>_>::operator[]
              ((Vector<amrex::StateData,_std::allocator<amrex::StateData>_> *)
               in_stack_fffffffffffff720,(size_type)in_stack_fffffffffffff718);
    local_350 = (pointer)amrex::StateData::prevTime((StateData *)in_stack_fffffffffffff730);
    local_358 = (pointer)(local_348 - (double)local_350);
    local_360._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(((double)local_350 + local_348) * 0.5);
    amrex::Vector<amrex::StateData,_std::allocator<amrex::StateData>_>::operator[]
              ((Vector<amrex::StateData,_std::allocator<amrex::StateData>_> *)
               in_stack_fffffffffffff720,(size_type)in_stack_fffffffffffff718);
    amrex::Geometry::Domain((Geometry *)(in_RDI + 0x10));
    amrex::DescriptorList::operator[]
              ((DescriptorList *)in_stack_fffffffffffff720,
               (int)((ulong)in_stack_fffffffffffff718 >> 0x20));
    amrex::AmrLevel::Factory(&in_stack_fffffffffffff720->super_AmrLevel);
    amrex::StateData::define
              (in_stack_fffffffffffff800,in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f0,
               in_stack_fffffffffffff7e8,in_stack_fffffffffffff7e0,
               (Real)CONCAT44(in_stack_fffffffffffff7dc,in_stack_fffffffffffff7d8),
               in_stack_fffffffffffff7d0,in_stack_fffffffffffff7c8);
    computeGradP(in_stack_00000080,in_stack_00000078);
    amrex::Vector<amrex::StateData,_std::allocator<amrex::StateData>_>::operator[]
              ((Vector<amrex::StateData,_std::allocator<amrex::StateData>_> *)
               in_stack_fffffffffffff720,(size_type)in_stack_fffffffffffff718);
    amrex::StateData::allocOldData(in_stack_fffffffffffff7a0);
    computeGradP(in_stack_00000080,in_stack_00000078);
  }
  buildMetrics(pNVar3);
  if (projector == (Projection *)0x0) {
    pPVar4 = (Projection *)operator_new(0x68);
    amrex::AmrMesh::finestLevel(*(AmrMesh **)(in_RDI + 0x150));
    Projection::Projection
              ((Projection *)in_stack_fffffffffffff910,(Amr *)in_stack_fffffffffffff908,
               in_stack_fffffffffffff900,(int)((ulong)in_stack_fffffffffffff8f8 >> 0x20),
               (int)in_stack_fffffffffffff8f8,iVar11);
    projector = pPVar4;
  }
  iVar11 = (int)((ulong)in_stack_fffffffffffff900 >> 0x20);
  Projection::install_level
            ((Projection *)in_stack_fffffffffffff920,(int)((ulong)in_stack_fffffffffffff918 >> 0x20)
             ,in_stack_fffffffffffff910,
             (Vector<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
              *)in_stack_fffffffffffff908);
  _finest_level = (int)((ulong)in_stack_fffffffffffff910 >> 0x20);
  if (mac_projector == (MacProj *)0x0) {
    pMVar5 = (MacProj *)operator_new(0x60);
    amrex::AmrMesh::finestLevel(*(AmrMesh **)(in_RDI + 0x150));
    MacProj::MacProj((MacProj *)in_stack_fffffffffffff920,in_stack_fffffffffffff918,_finest_level,
                     (BCRec *)in_stack_fffffffffffff908,iVar11);
    mac_projector = pMVar5;
  }
  MacProj::install_level(in_stack_fffffffffffff930,iVar2,in_stack_fffffffffffff920);
  this_00 = amrex::Vector<amrex::StateData,_std::allocator<amrex::StateData>_>::operator[]
                      ((Vector<amrex::StateData,_std::allocator<amrex::StateData>_> *)
                       in_stack_fffffffffffff720,(size_type)in_stack_fffffffffffff718);
  local_368 = amrex::StateData::boxArray(this_00);
  amrex::AmrMesh::Geom
            ((AmrMesh *)in_stack_fffffffffffff720,(int)((ulong)in_stack_fffffffffffff718 >> 0x20));
  init_eb(in_stack_fffffffffffff730,in_stack_fffffffffffff728,(BoxArray *)in_stack_fffffffffffff720,
          in_stack_fffffffffffff718);
  if (0 < *(int *)(in_RDI + 8)) {
    aStack_390._8_8_ = 0;
    uStack_380 = 0;
    local_3f8[0xc] = (Amr *)0x0;
    aStack_390._M_allocated_capacity = 0;
    local_378 = (element_type *)0x0;
    amrex::MFInfo::MFInfo((MFInfo *)0x52851f);
    amrex::AmrLevel::Factory(&in_stack_fffffffffffff720->super_AmrLevel);
    amrex::MultiFab::define
              (in_stack_fffffffffffff770,in_stack_fffffffffffff768,
               (DistributionMapping *)in_stack_fffffffffffff760,
               (int)((ulong)in_stack_fffffffffffff758 >> 0x20),(int)in_stack_fffffffffffff758,
               (MFInfo *)in_stack_fffffffffffff750,in_stack_fffffffffffff780);
    amrex::MFInfo::~MFInfo((MFInfo *)0x528572);
    in_stack_fffffffffffff908 = (SyncRegister *)(in_RDI + 0xda0);
    local_3f8[8] = (Amr *)0x0;
    local_3f8[9] = (Amr *)0x0;
    local_3f8[6] = (Amr *)0x0;
    local_3f8[7] = (Amr *)0x0;
    local_3f8[10] = (Amr *)0x0;
    amrex::MFInfo::MFInfo((MFInfo *)0x5285de);
    amrex::AmrLevel::Factory(&in_stack_fffffffffffff720->super_AmrLevel);
    amrex::MultiFab::define
              (in_stack_fffffffffffff770,in_stack_fffffffffffff768,
               (DistributionMapping *)in_stack_fffffffffffff760,
               (int)((ulong)in_stack_fffffffffffff758 >> 0x20),(int)in_stack_fffffffffffff758,
               (MFInfo *)in_stack_fffffffffffff750,in_stack_fffffffffffff780);
    amrex::MFInfo::~MFInfo((MFInfo *)0x528630);
  }
  ref_ratio = (IntVect *)(in_RDI + 0xd8);
  dmap = (DistributionMapping *)(in_RDI + 0x140);
  local_3f8[2] = (Amr *)0x0;
  local_3f8[3] = (Amr *)0x0;
  local_3f8[0] = (Amr *)0x0;
  local_3f8[1] = (Amr *)0x0;
  local_3f8[4] = (Amr *)0x0;
  pBVar9 = (BoxArray *)local_3f8;
  amrex::MFInfo::MFInfo((MFInfo *)0x5286ec);
  amrex::AmrLevel::Factory(&in_stack_fffffffffffff720->super_AmrLevel);
  amrex::MultiFab::define
            (in_stack_fffffffffffff770,in_stack_fffffffffffff768,
             (DistributionMapping *)in_stack_fffffffffffff760,
             (int)((ulong)in_stack_fffffffffffff758 >> 0x20),(int)in_stack_fffffffffffff758,
             (MFInfo *)in_stack_fffffffffffff750,in_stack_fffffffffffff780);
  amrex::MFInfo::~MFInfo((MFInfo *)0x52873f);
  local_488._112_8_ = (element_type *)0x0;
  local_488._120_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_488._96_8_ = (element_type *)0x0;
  local_488._104_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_408 = (element_type *)0x0;
  amrex::MFInfo::MFInfo((MFInfo *)0x5287ad);
  amrex::AmrLevel::Factory(&in_stack_fffffffffffff720->super_AmrLevel);
  amrex::MultiFab::define
            (in_stack_fffffffffffff770,in_stack_fffffffffffff768,
             (DistributionMapping *)in_stack_fffffffffffff760,
             (int)((ulong)in_stack_fffffffffffff758 >> 0x20),(int)in_stack_fffffffffffff758,
             (MFInfo *)in_stack_fffffffffffff750,in_stack_fffffffffffff780);
  amrex::MFInfo::~MFInfo((MFInfo *)0x528800);
  local_488._64_8_ = (pointer)0x0;
  local_488._72_8_ = (pointer)0x0;
  local_488._48_8_ = (pointer)0x0;
  local_488._56_8_ = (pointer)0x0;
  local_488._80_8_ = (pointer)0x0;
  amrex::MFInfo::MFInfo((MFInfo *)0x52886e);
  pNVar3 = (NavierStokesBase *)amrex::AmrLevel::Factory(&in_stack_fffffffffffff720->super_AmrLevel);
  amrex::MultiFab::define
            (in_stack_fffffffffffff770,in_stack_fffffffffffff768,
             (DistributionMapping *)in_stack_fffffffffffff760,
             (int)((ulong)in_stack_fffffffffffff758 >> 0x20),(int)in_stack_fffffffffffff758,
             (MFInfo *)in_stack_fffffffffffff750,in_stack_fffffffffffff780);
  amrex::MFInfo::~MFInfo((MFInfo *)0x5288c1);
  *(undefined8 *)(in_RDI + 0x13a0) = 0;
  *(undefined8 *)(in_RDI + 0x13a8) = 0;
  if ((0 < *(int *)(in_RDI + 8)) && (do_sync_proj != 0)) {
    in_stack_fffffffffffff8a0 = (Vector<int,_std::allocator<int>_> *)operator_new(0x1280);
    SyncRegister::SyncRegister(in_stack_fffffffffffff908,pBVar9,dmap,ref_ratio);
    *(Vector<int,_std::allocator<int>_> **)(in_RDI + 0x16b0) = in_stack_fffffffffffff8a0;
  }
  if ((0 < *(int *)(in_RDI + 8)) && (do_reflux != 0)) {
    pvVar6 = operator_new(0x988);
    amrex::FluxRegister::FluxRegister
              (in_stack_fffffffffffff750,in_stack_fffffffffffff748,
               (DistributionMapping *)in_stack_fffffffffffff740,(IntVect *)in_stack_fffffffffffff738
               ,(int)((ulong)in_stack_fffffffffffff730 >> 0x20),(int)in_stack_fffffffffffff730);
    *(void **)(in_RDI + 0x16b8) = pvVar6;
  }
  if ((0 < *(int *)(in_RDI + 8)) && (do_reflux != 0)) {
    pvVar6 = operator_new(0x988);
    amrex::FluxRegister::FluxRegister
              (in_stack_fffffffffffff750,in_stack_fffffffffffff748,
               (DistributionMapping *)in_stack_fffffffffffff740,(IntVect *)in_stack_fffffffffffff738
               ,(int)((ulong)in_stack_fffffffffffff730 >> 0x20),(int)in_stack_fffffffffffff730);
    *(void **)(in_RDI + 0x16c0) = pvVar6;
  }
  iVar11 = *(int *)(in_RDI + 8);
  iVar2 = amrex::AmrMesh::finestLevel(*(AmrMesh **)(in_RDI + 0x150));
  if (iVar11 < iVar2) {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffff720,(char *)pNVar3);
    if (bVar1) {
      in_stack_fffffffffffff87c = nghost_state(pNVar3);
    }
    else {
      in_stack_fffffffffffff87c = 1;
    }
    in_stack_fffffffffffff860 = (FluxRegister *)(in_RDI + 0xf20);
    iVar10 = (int)((ulong)(in_RDI + 0xd8) >> 0x20);
    in_stack_fffffffffffff870 = (Diffusion *)(in_RDI + 0x140);
    local_488._16_8_ = (pointer)0x0;
    local_488._24_8_ = (pointer)0x0;
    local_488._0_8_ = (_func_int **)0x0;
    local_488._8_4_ = 0;
    local_488._12_4_ = 0;
    local_488._32_8_ = (pointer)0x0;
    in_stack_fffffffffffff880 = (Amr *)local_488;
    in_stack_fffffffffffff888 = in_stack_fffffffffffff87c;
    local_488._44_4_ = in_stack_fffffffffffff87c;
    amrex::MFInfo::MFInfo((MFInfo *)0x528c4d);
    amrex::AmrLevel::Factory(&in_stack_fffffffffffff720->super_AmrLevel);
    amrex::MultiFab::define
              (in_stack_fffffffffffff770,in_stack_fffffffffffff768,
               (DistributionMapping *)in_stack_fffffffffffff760,
               (int)((ulong)in_stack_fffffffffffff758 >> 0x20),(int)in_stack_fffffffffffff758,
               (MFInfo *)in_stack_fffffffffffff750,in_stack_fffffffffffff780);
    amrex::MFInfo::~MFInfo((MFInfo *)0x528ca4);
    local_548._160_8_ = 0.0;
    local_548._168_8_ = 0.0;
    local_548._144_8_ = 0.0;
    local_548._152_8_ = 0.0;
    local_548._176_4_ = 0.0;
    local_548._180_4_ = 0.0;
    amrex::MFInfo::MFInfo((MFInfo *)0x528d30);
    pNVar3 = (NavierStokesBase *)
             amrex::AmrLevel::Factory(&in_stack_fffffffffffff720->super_AmrLevel);
    amrex::MultiFab::define
              (in_stack_fffffffffffff770,in_stack_fffffffffffff768,
               (DistributionMapping *)in_stack_fffffffffffff760,
               (int)((ulong)in_stack_fffffffffffff758 >> 0x20),(int)in_stack_fffffffffffff758,
               (MFInfo *)in_stack_fffffffffffff750,in_stack_fffffffffffff780);
    amrex::MFInfo::~MFInfo((MFInfo *)0x528d89);
  }
  iVar2 = (int)((ulong)pNVar3 >> 0x20);
  pvVar6 = operator_new(0x50);
  if (0 < *(int *)(in_RDI + 8)) {
    getLevel(in_stack_fffffffffffff720,iVar2);
  }
  Diffusion::Diffusion
            ((Diffusion *)CONCAT44(iVar11,in_stack_fffffffffffff888),in_stack_fffffffffffff880,
             (NavierStokesBase *)CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878),
             in_stack_fffffffffffff870,iVar10,in_stack_fffffffffffff860,in_stack_fffffffffffff8a0);
  *(void **)(in_RDI + 0xbf8) = pvVar6;
  pvVar6 = operator_new(0x180);
  local_548[0x5f] = 1;
  local_548._112_8_ = 0.0;
  local_548._120_8_ = 0.0;
  local_548._96_8_ = 0;
  local_548._104_8_ = 0.0;
  local_548._128_8_ = 0.0;
  amrex::MFInfo::MFInfo((MFInfo *)0x528f34);
  amrex::AmrLevel::Factory(&in_stack_fffffffffffff720->super_AmrLevel);
  amrex::MultiFab::MultiFab
            (in_stack_fffffffffffff760,in_stack_fffffffffffff758,
             (DistributionMapping *)in_stack_fffffffffffff750,
             (int)((ulong)in_stack_fffffffffffff748 >> 0x20),(int)in_stack_fffffffffffff748,
             (MFInfo *)in_stack_fffffffffffff740,
             (FabFactory<amrex::FArrayBox> *)in_stack_fffffffffffff770);
  local_548[0x5f] = 0;
  *(void **)(in_RDI + 0xc00) = pvVar6;
  amrex::MFInfo::~MFInfo((MFInfo *)0x528faa);
  pvVar6 = operator_new(0x180);
  local_548[0x2f] = 1;
  local_548._64_8_ = 0.0;
  local_548._72_8_ = 0.0;
  local_548._48_8_ = 0.0;
  local_548._56_8_ = 0.0;
  local_548._80_8_ = 0.0;
  amrex::MFInfo::MFInfo((MFInfo *)0x52903b);
  amrex::AmrLevel::Factory(&in_stack_fffffffffffff720->super_AmrLevel);
  amrex::MultiFab::MultiFab
            (in_stack_fffffffffffff760,in_stack_fffffffffffff758,
             (DistributionMapping *)in_stack_fffffffffffff750,
             (int)((ulong)in_stack_fffffffffffff748 >> 0x20),(int)in_stack_fffffffffffff748,
             (MFInfo *)in_stack_fffffffffffff740,
             (FabFactory<amrex::FArrayBox> *)in_stack_fffffffffffff770);
  local_548[0x2f] = 0;
  *(void **)(in_RDI + 0xc08) = pvVar6;
  amrex::MFInfo::~MFInfo((MFInfo *)0x5290b1);
  pvVar6 = operator_new(0x180);
  local_549 = 1;
  iVar10 = (int)((ulong)(in_RDI + 0xd8) >> 0x20);
  lVar7 = in_RDI + 0x140;
  local_548._16_8_ = 0;
  local_548._24_8_ = 0.0;
  local_548._0_8_ = (_func_int **)0x0;
  local_548._8_8_ = 0;
  local_548._32_8_ = 0.0;
  pNVar3 = (NavierStokesBase *)local_548;
  amrex::MFInfo::MFInfo((MFInfo *)0x52912f);
  amrex::AmrLevel::Factory(&in_stack_fffffffffffff720->super_AmrLevel);
  amrex::MultiFab::MultiFab
            (in_stack_fffffffffffff760,in_stack_fffffffffffff758,
             (DistributionMapping *)in_stack_fffffffffffff750,
             (int)((ulong)in_stack_fffffffffffff748 >> 0x20),(int)in_stack_fffffffffffff748,
             (MFInfo *)in_stack_fffffffffffff740,
             (FabFactory<amrex::FArrayBox> *)in_stack_fffffffffffff770);
  local_549 = 0;
  *(void **)(in_RDI + 0xc10) = pvVar6;
  amrex::MFInfo::~MFInfo((MFInfo *)0x52919e);
  pFVar8 = (FabFactory<amrex::FArrayBox> *)operator_new(0x180);
  local_579 = 1;
  local_568 = 0;
  uStack_560 = 0;
  local_578 = 0;
  uStack_570 = 0;
  local_558 = 0;
  factory = pFVar8;
  amrex::MFInfo::MFInfo((MFInfo *)0x529210);
  pBVar9 = (BoxArray *)amrex::AmrLevel::Factory(&in_stack_fffffffffffff720->super_AmrLevel);
  amrex::MultiFab::MultiFab
            (in_stack_fffffffffffff760,in_stack_fffffffffffff758,
             (DistributionMapping *)in_stack_fffffffffffff750,
             (int)((ulong)in_stack_fffffffffffff748 >> 0x20),(int)in_stack_fffffffffffff748,
             (MFInfo *)in_stack_fffffffffffff740,factory);
  local_579 = 0;
  *(FabFactory<amrex::FArrayBox> **)(in_RDI + 0xc18) = pFVar8;
  amrex::MFInfo::~MFInfo((MFInfo *)0x529273);
  amrex::BoxArray::operator=((BoxArray *)in_stack_fffffffffffff720,pBVar9);
  std::vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::resize
            ((vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)in_stack_fffffffffffff740,
             (size_type)in_stack_fffffffffffff738);
  fetchBCArray(pNVar3,(int)((ulong)lVar7 >> 0x20),(int)lVar7,iVar10);
  amrex::Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::operator=
            ((Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)in_stack_fffffffffffff720,
             (Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)pBVar9);
  amrex::Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::~Vector
            ((Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)0x5292f1);
  amrex::PODVector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::resize
            ((PODVector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)in_stack_fffffffffffff730,
             (size_type)in_stack_fffffffffffff728);
  amrex::Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::Vector
            ((Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)in_stack_fffffffffffff720,
             (Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)pBVar9);
  amrex::convertToDeviceVector<amrex::BCRec>(in_stack_fffffffffffff738);
  a_new_size = local_5b0;
  amrex::PODVector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::operator=
            ((PODVector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)in_stack_fffffffffffff720,
             (PODVector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)pBVar9);
  amrex::PODVector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::~PODVector
            ((PODVector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)in_stack_fffffffffffff720);
  amrex::Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::~Vector
            ((Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)0x52936d);
  v = (Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)(in_RDI + 0xbb0);
  std::vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::resize
            ((vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)in_stack_fffffffffffff740,
             (size_type)v);
  this_01 = local_5e0;
  fetchBCArray(pNVar3,(int)((ulong)lVar7 >> 0x20),(int)lVar7,iVar10);
  amrex::Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::operator=
            ((Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)in_stack_fffffffffffff720,
             (Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)pBVar9);
  amrex::Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::~Vector
            ((Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)0x5293ce);
  amrex::PODVector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::resize
            (this_01,(size_type)a_new_size);
  amrex::Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::Vector
            ((Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)in_stack_fffffffffffff720,
             (Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)pBVar9);
  amrex::convertToDeviceVector<amrex::BCRec>(v);
  amrex::PODVector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::operator=
            ((PODVector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)in_stack_fffffffffffff720,
             (PODVector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)pBVar9);
  amrex::PODVector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::~PODVector
            ((PODVector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)in_stack_fffffffffffff720);
  amrex::Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::~Vector
            ((Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)0x52944a);
  return;
}

Assistant:

void
NavierStokesBase::restart (Amr&          papa,
                           std::istream& is,
                           bool          bReadSpecial)
{
    Print()<<"\nWARNING! Note that you can't drop data from the checkpoint file.\n"
           <<" If your checkpoint file contains Average_Type, then your inputs\n"
	   <<" must also specify ns.avg_interval>0.\n"<<std::endl;

    AmrLevel::restart(papa,is,bReadSpecial);

    if ( gradp_in_checkpoint==0 )
    {
      Print()<<"WARNING! GradP not found in checkpoint file. Recomputing from Pressure."
	     <<std::endl;

      //
      // define state[Gradp_Type] and
      // Compute GradP from the Pressure
      //
      Real cur_time = state[Press_Type].curTime();
      Real prev_time = state[Press_Type].prevTime();
      Real dt = cur_time - prev_time;
      // Because P and Gp are Interval type, this is the time for define()
      Real time = 0.5 * (prev_time + cur_time);

      state[Gradp_Type].define(geom.Domain(), grids, dmap, desc_lst[Gradp_Type],
			       time, dt, Factory());
      computeGradP(cur_time);

      // now allocate the old data and fill
      state[Gradp_Type].allocOldData();
      computeGradP(prev_time);
    }

    //
    // Build metric coefficients for RZ calculations.
    // Build volume and areas.
    //
    buildMetrics();

    if (projector == 0)
    {
        projector = new Projection(parent,&phys_bc,do_sync_proj,
                                   parent->finestLevel(),radius_grow);
    }
    projector->install_level(level, this, &radius);

    if (mac_projector == 0)
    {
        mac_projector = new MacProj(parent,parent->finestLevel(),
                                    &phys_bc,radius_grow);
    }
    mac_projector->install_level(level,this);

    const BoxArray& P_grids = state[Press_Type].boxArray();
#ifdef AMREX_USE_EB
    init_eb(parent->Geom(level), grids, dmap);
#endif

    //
    // Alloc space for density and temporary pressure variables.
    //
    if (level > 0)
    {
        rho_avg.define(grids,dmap,1,1,MFInfo(),Factory());
        p_avg.define(P_grids,dmap,1,0,MFInfo(),Factory());
    }
    //FIXME see similar stuff in constructor
    rho_half.define (grids,dmap,1,1,MFInfo(),Factory());
    rho_ptime.define(grids,dmap,1,1,MFInfo(),Factory());
    rho_ctime.define(grids,dmap,1,1,MFInfo(),Factory());
    rho_qtime  = 0;
    rho_tqtime = 0;

    AMREX_ASSERT(sync_reg == 0);
    if (level > 0 && do_sync_proj)
    {
        sync_reg = new SyncRegister(grids,dmap,crse_ratio);
    }
    AMREX_ASSERT(advflux_reg == 0);
    if (level > 0 && do_reflux)
    {
        advflux_reg = new FluxRegister(grids,dmap,crse_ratio,level,NUM_STATE);
    }
    AMREX_ASSERT(viscflux_reg == 0);
    if (level > 0 && do_reflux)
    {
        viscflux_reg = new FluxRegister(grids,dmap,crse_ratio,level,NUM_STATE);
    }

    if (level < parent->finestLevel())
    {
#ifdef AMREX_USE_EB
        int ng_sync = (redistribution_type == "StateRedist") ? nghost_state() : 1;
#else
	int ng_sync = 1;
#endif

	Vsync.define(grids,dmap,AMREX_SPACEDIM,ng_sync,MFInfo(),Factory());
        Ssync.define(grids,dmap,NUM_STATE-AMREX_SPACEDIM,ng_sync,MFInfo(),Factory());
    }

    diffusion = new Diffusion(parent, this,
                              (level > 0) ? getLevel(level-1).diffusion : 0,
                              NUM_STATE, viscflux_reg,is_diffusive);
    //
    // Allocate the storage for variable viscosity and diffusivity
    //
    diffn_cc = new MultiFab(grids, dmap, NUM_STATE-Density-1, 1, MFInfo(), Factory());
    diffnp1_cc = new MultiFab(grids, dmap, NUM_STATE-Density-1, 1, MFInfo(), Factory());
    viscn_cc = new MultiFab(grids, dmap, 1, 1, MFInfo(), Factory());
    viscnp1_cc = new MultiFab(grids, dmap, 1, 1, MFInfo(), Factory());

    old_intersect_new          = grids;

    //
    // Initialize BCRec for use with advection
    //
    m_bcrec_velocity.resize(AMREX_SPACEDIM);
    m_bcrec_velocity = fetchBCArray(State_Type,Xvel,AMREX_SPACEDIM);

    m_bcrec_velocity_d.resize(AMREX_SPACEDIM);
    m_bcrec_velocity_d = convertToDeviceVector(m_bcrec_velocity);

    m_bcrec_scalars.resize(NUM_SCALARS);
    m_bcrec_scalars = fetchBCArray(State_Type,Density,NUM_SCALARS);

    m_bcrec_scalars_d.resize(NUM_SCALARS);
    m_bcrec_scalars_d = convertToDeviceVector(m_bcrec_scalars);
}